

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void * __thiscall ImGuiStorage::GetVoidPtr(ImGuiStorage *this,ImGuiID key)

{
  ImGuiStoragePair *pIVar1;
  ulong uVar2;
  ImGuiStoragePair *pIVar3;
  ulong uVar4;
  ulong uVar5;
  
  pIVar1 = (this->Data).Data;
  uVar4 = (ulong)(this->Data).Size;
  pIVar3 = pIVar1;
  uVar5 = uVar4;
  while (uVar2 = uVar5, uVar2 != 0) {
    uVar5 = uVar2 >> 1;
    if (pIVar3[uVar5].key < key) {
      pIVar3 = pIVar3 + uVar5 + 1;
      uVar5 = ~uVar5 + uVar2;
    }
  }
  if ((pIVar3 != pIVar1 + uVar4) && (pIVar3->key == key)) {
    return (pIVar3->field_1).val_p;
  }
  return (void *)0x0;
}

Assistant:

static ImGuiStorage::ImGuiStoragePair* LowerBound(ImVector<ImGuiStorage::ImGuiStoragePair>& data, ImGuiID key)
{
    ImGuiStorage::ImGuiStoragePair* first = data.Data;
    ImGuiStorage::ImGuiStoragePair* last = data.Data + data.Size;
    size_t count = (size_t)(last - first);
    while (count > 0)
    {
        size_t count2 = count >> 1;
        ImGuiStorage::ImGuiStoragePair* mid = first + count2;
        if (mid->key < key)
        {
            first = ++mid;
            count -= count2 + 1;
        }
        else
        {
            count = count2;
        }
    }
    return first;
}